

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_helo(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  smtp_conn *smtpc;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"HELO %s",(conn->proto).ftpc.newhost);
  if (CVar1 == CURLE_OK) {
    smtp_state(data,SMTP_HELO);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_helo(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  smtpc->sasl.authused = SASL_AUTH_NONE; /* No authentication mechanism used
                                            in smtp connections */

  /* Send the HELO command */
  result = Curl_pp_sendf(data, &smtpc->pp, "HELO %s", smtpc->domain);

  if(!result)
    smtp_state(data, SMTP_HELO);

  return result;
}